

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

string * __thiscall
StringInstance::op_substringFromIndex
          (string *__return_storage_ptr__,StringInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  string *value;
  long lVar2;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  size_type *psVar6;
  char *pcVar7;
  string local_c0;
  string local_a0;
  IntegerInstance local_80;
  
  value = (arguments->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)value == 0x20) {
    IntegerInstance::IntegerInstance(&local_80,value);
    CharacterInstance::~CharacterInstance((CharacterInstance *)&local_80);
    if ((-1 < local_80._value) && (local_80._value <= (int)(this->_value)._M_string_length)) {
      std::__cxx11::string::substr((ulong)&local_a0,(ulong)&this->_value);
      str_utils::escape(&local_c0,&local_a0,'\"');
      plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,0x15bd93);
      p_Var1 = &local_80.super_Instance.super_enable_shared_from_this<Instance>._M_weak_this.
                super___weak_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      plVar5 = plVar3 + 2;
      if ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)*plVar3 ==
          (__weak_count<(__gnu_cxx::_Lock_policy)2> *)plVar5) {
        local_80.super_Instance.super_enable_shared_from_this<Instance>._M_weak_this.
        super___weak_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar5;
        local_80.super_Instance._type._M_dataplus._M_p = (pointer)plVar3[3];
        local_80.super_Instance._vptr_Instance = (_func_int **)p_Var1;
      }
      else {
        local_80.super_Instance.super_enable_shared_from_this<Instance>._M_weak_this.
        super___weak_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar5;
        local_80.super_Instance._vptr_Instance = (_func_int **)*plVar3;
      }
      local_80.super_Instance.super_enable_shared_from_this<Instance>._M_weak_this.
      super___weak_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_80);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar6 = (size_type *)(plVar3 + 2);
      if ((size_type *)*plVar3 == psVar6) {
        lVar2 = plVar3[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      }
      __return_storage_ptr__->_M_string_length = plVar3[1];
      *plVar3 = (long)psVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)local_80.super_Instance._vptr_Instance !=
          p_Var1) {
        operator_delete(local_80.super_Instance._vptr_Instance);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      return __return_storage_ptr__;
    }
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar7 = "RuntimeError: invalid argument.";
  }
  else {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar7 = "RuntimeError: wrong number of arguments.";
  }
  *puVar4 = pcVar7;
  __cxa_throw(puVar4,&char_const*::typeinfo,0);
}

Assistant:

std::string StringInstance::op_substringFromIndex(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    int from_index = IntegerInstance(arguments[0]).value();
    if (from_index < 0 || from_index > int(_value.size()))
        throw EXC_INVALID_ARGUMENT;
    return "\"" + str_utils::escape(_value.substr(from_index), '"') + "\"";
}